

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O2

int Res_FilterCandidates
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax,int fArea)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  Abc_Obj_t *pAVar8;
  uint *puVar9;
  void *pvVar10;
  uint *r;
  long lVar11;
  long lVar12;
  int Level;
  int i;
  long lVar13;
  long lVar14;
  
  puVar6 = (uint *)Vec_PtrEntry(pSim->vOuts,1);
  iVar3 = Abc_InfoIsOne(puVar6,pSim->nWordsOut);
  Level = 0;
  if (iVar3 != 0) {
    puVar6 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    iVar3 = Abc_InfoIsOne(puVar6,pSim->nWordsOut);
    Level = 0;
    if (iVar3 != 0) {
      Vec_VecClear(vResubs);
      Vec_VecClear(vResubsW);
      lVar11 = 0;
      Level = 0;
      while( true ) {
        pAVar8 = pWin->pNode;
        uVar7 = (ulong)(pAVar8->vFanins).nSize;
        if ((long)uVar7 <= lVar11) break;
        if ((fArea == 0) ||
           (*(int *)((long)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar11]] + 0x2c) < 2
           )) {
          bVar2 = (byte)lVar11 & 0x1f;
          puVar6 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          iVar3 = Abc_InfoIsOne(puVar6,pSim->nWordsOut);
          if (iVar3 != 0) {
            pAVar8 = Abc_NtkPo(pAig,0);
            Vec_VecPush(vResubs,Level,pAVar8);
            pAVar8 = Abc_NtkPo(pAig,1);
            Vec_VecPush(vResubs,Level,pAVar8);
            for (lVar13 = 0; pAVar8 = pWin->pNode, lVar13 < (pAVar8->vFanins).nSize;
                lVar13 = lVar13 + 1) {
              if (lVar11 != lVar13) {
                pvVar10 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar13]];
                pAVar8 = Abc_NtkPo(pAig,(int)lVar13 + 2);
                Vec_VecPush(vResubs,Level,pAVar8);
                Vec_VecPush(vResubsW,Level,pvVar10);
              }
            }
            Level = Level + 1;
            if (Level == vResubs->nSize) {
              return Level;
            }
          }
        }
        lVar11 = lVar11 + 1;
      }
      for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
        if (*(int *)((long)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar11]] + 0x2c) < 2
           ) {
          bVar2 = (byte)lVar11 & 0x1f;
          puVar6 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          for (iVar3 = (pWin->pNode->vFanins).nSize + 2; iVar3 < pAig->vPos->nSize;
              iVar3 = iVar3 + 1) {
            puVar9 = (uint *)Vec_PtrEntry(pSim->vOuts,iVar3);
            iVar5 = (pWin->pNode->vFanins).nSize;
            iVar4 = Abc_InfoIsOrOne(puVar6,puVar9,pSim->nWordsOut);
            if (iVar4 != 0) {
              pAVar8 = Abc_NtkPo(pAig,0);
              Vec_VecPush(vResubs,Level,pAVar8);
              pAVar8 = Abc_NtkPo(pAig,1);
              Vec_VecPush(vResubs,Level,pAVar8);
              for (lVar13 = 0; pAVar8 = pWin->pNode, lVar13 < (pAVar8->vFanins).nSize;
                  lVar13 = lVar13 + 1) {
                if (lVar11 != lVar13) {
                  pvVar10 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar13]];
                  pAVar8 = Abc_NtkPo(pAig,(int)lVar13 + 2);
                  Vec_VecPush(vResubs,Level,pAVar8);
                  Vec_VecPush(vResubsW,Level,pvVar10);
                }
              }
              pAVar8 = Abc_NtkPo(pAig,iVar3);
              Vec_VecPush(vResubs,Level,pAVar8);
              pvVar10 = Vec_PtrEntry(pWin->vDivs,(iVar3 - iVar5) + -2);
              Vec_VecPush(vResubsW,Level,pvVar10);
              Level = Level + 1;
              if (Level == vResubs->nSize) {
                return Level;
              }
            }
          }
          pAVar8 = pWin->pNode;
          uVar7 = (ulong)(uint)(pAVar8->vFanins).nSize;
        }
      }
      if ((int)uVar7 < nFaninsMax) {
        for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
          if (*(int *)((long)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar11]] + 0x2c) <
              2) {
            bVar2 = (byte)lVar11 & 0x1f;
            puVar6 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2)
            ;
            iVar3 = pAig->vPos->nSize;
            iVar5 = (pWin->pNode->vFanins).nSize + 2;
            while (iVar4 = iVar5, iVar4 < iVar3) {
              puVar9 = (uint *)Vec_PtrEntry(pSim->vOuts,iVar4);
              iVar1 = (pWin->pNode->vFanins).nSize;
              for (i = iVar4 + 1; iVar3 = pAig->vPos->nSize, iVar5 = iVar4 + 1, i < iVar3; i = i + 1
                  ) {
                r = (uint *)Vec_PtrEntry(pSim->vOuts,i);
                iVar3 = (pWin->pNode->vFanins).nSize;
                iVar5 = Abc_InfoIsOrOne3(puVar6,puVar9,r,pSim->nWordsOut);
                if (iVar5 != 0) {
                  pAVar8 = Abc_NtkPo(pAig,0);
                  Vec_VecPush(vResubs,Level,pAVar8);
                  pAVar8 = Abc_NtkPo(pAig,1);
                  Vec_VecPush(vResubs,Level,pAVar8);
                  for (lVar13 = 0; pAVar8 = pWin->pNode, lVar13 < (pAVar8->vFanins).nSize;
                      lVar13 = lVar13 + 1) {
                    if (lVar11 != lVar13) {
                      pvVar10 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar13]];
                      pAVar8 = Abc_NtkPo(pAig,(int)lVar13 + 2);
                      Vec_VecPush(vResubs,Level,pAVar8);
                      Vec_VecPush(vResubsW,Level,pvVar10);
                    }
                  }
                  pAVar8 = Abc_NtkPo(pAig,iVar4);
                  Vec_VecPush(vResubs,Level,pAVar8);
                  pAVar8 = Abc_NtkPo(pAig,i);
                  Vec_VecPush(vResubs,Level,pAVar8);
                  pvVar10 = Vec_PtrEntry(pWin->vDivs,(iVar4 - iVar1) + -2);
                  Vec_VecPush(vResubsW,Level,pvVar10);
                  pvVar10 = Vec_PtrEntry(pWin->vDivs,(i - iVar3) + -2);
                  Vec_VecPush(vResubsW,Level,pvVar10);
                  Level = Level + 1;
                  if (Level == vResubs->nSize) {
                    return Level;
                  }
                }
              }
            }
            pAVar8 = pWin->pNode;
            uVar7 = (ulong)(uint)(pAVar8->vFanins).nSize;
          }
        }
      }
      if (fArea == 0) {
        lVar11 = 1;
        lVar13 = 0;
        while (lVar13 < (int)uVar7) {
          for (lVar14 = lVar11; (int)(uint)lVar14 < (int)uVar7; lVar14 = lVar14 + 1) {
            puVar6 = Res_FilterCollectFaninInfo
                               (pWin,pSim,~(1 << ((byte)lVar13 & 0x1f) | 1 << ((uint)lVar14 & 0x1f))
                               );
            for (iVar3 = (pWin->pNode->vFanins).nSize + 2; iVar3 < pAig->vPos->nSize;
                iVar3 = iVar3 + 1) {
              puVar9 = (uint *)Vec_PtrEntry(pSim->vOuts,iVar3);
              iVar5 = (pWin->pNode->vFanins).nSize;
              iVar4 = Abc_InfoIsOrOne(puVar6,puVar9,pSim->nWordsOut);
              if (iVar4 != 0) {
                pAVar8 = Abc_NtkPo(pAig,0);
                Vec_VecPush(vResubs,Level,pAVar8);
                pAVar8 = Abc_NtkPo(pAig,1);
                Vec_VecPush(vResubs,Level,pAVar8);
                for (lVar12 = 0; pAVar8 = pWin->pNode, lVar12 < (pAVar8->vFanins).nSize;
                    lVar12 = lVar12 + 1) {
                  if (lVar14 != lVar12 && lVar13 != lVar12) {
                    pvVar10 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar12]];
                    pAVar8 = Abc_NtkPo(pAig,(int)lVar12 + 2);
                    Vec_VecPush(vResubs,Level,pAVar8);
                    Vec_VecPush(vResubsW,Level,pvVar10);
                  }
                }
                pAVar8 = Abc_NtkPo(pAig,iVar3);
                Vec_VecPush(vResubs,Level,pAVar8);
                pvVar10 = Vec_PtrEntry(pWin->vDivs,(iVar3 - iVar5) + -2);
                Vec_VecPush(vResubsW,Level,pvVar10);
                Level = Level + 1;
                if (Level == vResubs->nSize) {
                  return Level;
                }
              }
            }
            uVar7 = (ulong)(uint)(pWin->pNode->vFanins).nSize;
          }
          lVar11 = lVar11 + 1;
          lVar13 = lVar13 + 1;
        }
      }
    }
  }
  return Level;
}

Assistant:

int Res_FilterCandidates( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax, int fArea )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFaninTemp;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, i, i2, d, d2, iDiv, iDiv2, k;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing each fanin
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( fArea && Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
        if ( RetValue )
        {
//            printf( "Node %4d. Candidate fanin %4d.\n", pWin->pNode->Id, pFanin->Id );
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;    
        }
    }

    // try replacing each critical fanin by a non-critical fanin
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        // go over the set of divisors
        for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
        {
            pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
            iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
            if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;           
        }
    }

    // consider the case when two fanins can be added instead of one
    if ( Abc_ObjFaninNum(pWin->pNode) < nFaninsMax )
    {
        // try to replace each critical fanin by two non-critical fanins
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            if ( Abc_ObjFanoutNum(pFanin) > 1 )
                continue;
            // get simulation info without this fanin
            pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
            // go over the set of divisors
            for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
            {
                pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                // go through the second divisor
                for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
                {
                    pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
                    iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }

    // try to replace two nets by one
    if ( !fArea )
    {
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            for ( i2 = i + 1; i2 < Abc_ObjFaninNum(pWin->pNode); i2++ )
            {
                pFanin2 = Abc_ObjFanin(pWin->pNode, i2);
                // get simulation info without these fanins
                pInfo = Res_FilterCollectFaninInfo( pWin, pSim, (~(1 << i)) & (~(1 << i2)) );
                // go over the set of divisors
                for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
                {
                    pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                    iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i && k != i2 )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }
    return Counter;
}